

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RhoR.cpp
# Opt level: O2

void __thiscall OpenMD::RhoR::process(RhoR *this)

{
  SelectionManager *this_00;
  int *piVar1;
  pointer pdVar2;
  pointer piVar3;
  int iVar4;
  pointer pdVar5;
  pointer piVar6;
  StuntDouble *this_01;
  int whichFrame;
  double dVar7;
  Thermo thermo;
  int i;
  Vector3d pos;
  Vector3d CenterOfMass;
  Vector3d r12;
  DumpReader reader;
  Thermo local_12f8;
  int local_12ec;
  SelectionSet local_12e8;
  Vector<double,_3U> local_12d0;
  Vector<double,_3U> local_12b8;
  Vector<double,_3U> local_12a0;
  DumpReader local_1288;
  
  local_12f8.info_ = (this->super_StaticAnalyser).info_;
  DumpReader::DumpReader(&local_1288,local_12f8.info_,&(this->super_StaticAnalyser).dumpFilename_);
  iVar4 = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = iVar4 / (this->super_StaticAnalyser).step_;
  pdVar2 = (this->avgRhoR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar5 = (this->avgRhoR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar5 != pdVar2; pdVar5 = pdVar5 + 1) {
    *pdVar5 = 0.0;
  }
  piVar3 = (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar6 = (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar6 != piVar3; piVar6 = piVar6 + 1) {
    *piVar6 = 0;
  }
  this_00 = &this->seleMan_;
  for (whichFrame = 0; whichFrame < iVar4;
      whichFrame = whichFrame + (this->super_StaticAnalyser).step_) {
    DumpReader::readFrame(&local_1288,whichFrame);
    this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
    Thermo::getCom((Vector3d *)&local_12d0,&local_12f8);
    if ((this->evaluator_).isDynamic_ == true) {
      SelectionEvaluator::evaluate(&local_12e8,&this->evaluator_);
      SelectionManager::setSelectionSet(this_00,&local_12e8);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_12e8.bitsets_);
    }
    this_01 = SelectionManager::beginSelected(this_00,&local_12ec);
    while (this_01 != (StuntDouble *)0x0) {
      StuntDouble::getPos((Vector3d *)&local_12e8,this_01);
      operator-(&local_12b8,&local_12d0,(Vector<double,_3U> *)&local_12e8);
      Vector<double,_3U>::Vector(&local_12a0,&local_12b8);
      dVar7 = Vector<double,_3U>::length(&local_12a0);
      if (dVar7 < this->len_) {
        piVar1 = (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + (int)(dVar7 / this->deltaR_);
        *piVar1 = *piVar1 + 1;
      }
      this_01 = SelectionManager::nextSelected(this_00,&local_12ec);
    }
  }
  processHistogram(this);
  writeRhoR(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void RhoR::process() {
    Thermo thermo(info_);
    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    std::fill(avgRhoR_.begin(), avgRhoR_.end(), 0.0);
    std::fill(histogram_.begin(), histogram_.end(), 0);

    for (int istep = 0; istep < nFrames; istep += step_) {
      int i;
      StuntDouble* sd;
      reader.readFrame(istep);
      currentSnapshot_      = info_->getSnapshotManager()->getCurrentSnapshot();
      Vector3d CenterOfMass = thermo.getCom();

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(i); sd != NULL;
           sd = seleMan_.nextSelected(i)) {
        Vector3d pos = sd->getPos();
        Vector3d r12 = CenterOfMass - pos;

        RealType distance = r12.length();

        if (distance < len_) {
          int whichBin = int(distance / deltaR_);
          histogram_[whichBin] += 1;
        }
      }
    }

    processHistogram();
    writeRhoR();
  }